

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O3

void __thiscall
Assimp::BlenderImporter::InternReadFile
          (BlenderImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  size_type __new_size;
  pointer pcVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  MemoryIOStream *__p;
  ostream *poVar4;
  BlenderImporter *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  uint uVar5;
  size_type sVar6;
  char *pcVar7;
  char magic [8];
  shared_ptr<Assimp::IOStream> stream;
  shared_ptr<Assimp::StreamReader<false,_false>_> reader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressed;
  FileDatabase file;
  Scene scene;
  undefined8 local_6a0;
  __shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> local_698;
  string local_688;
  shared_ptr<Assimp::IOStream> local_668;
  shared_ptr<Assimp::IOStream> local_658;
  StreamReader<false,_false> *local_648;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_640;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_638;
  BlenderImporter *local_620;
  aiScene *local_618;
  int8_t *local_610;
  int local_608;
  undefined1 *local_5f8;
  int local_5f0;
  undefined8 uStack_5d0;
  undefined4 uStack_5c8;
  undefined4 local_5c4;
  undefined4 uStack_5c0;
  undefined8 uStack_5bc;
  FileDatabase local_5a0;
  undefined1 local_4b8 [1064];
  element_type *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_88;
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_78;
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_68;
  undefined **local_60;
  char *local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  local_638.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_638.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_638.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Blender::FileDatabase::FileDatabase(&local_5a0);
  pcVar1 = local_4b8 + 0x10;
  local_4b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"rb","");
  iVar2 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_4b8._0_8_);
  local_698._M_ptr = (element_type *)CONCAT44(extraout_var,iVar2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IOStream*>
            (&local_698._M_refcount,local_698._M_ptr);
  if ((pointer)local_4b8._0_8_ != pcVar1) {
    operator_delete((void *)local_4b8._0_8_);
  }
  if (local_698._M_ptr == (IOStream *)0x0) {
    local_4b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4b8,"Could not open file for reading","");
    LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_4b8);
    if ((pointer)local_4b8._0_8_ != pcVar1) {
      operator_delete((void *)local_4b8._0_8_);
    }
  }
  local_6a0 = 0;
  (*(local_698._M_ptr)->_vptr_IOStream[2])(local_698._M_ptr,&local_6a0,7,1);
  if (local_6a0 != 0x5245444e454c42) {
    if (((char)local_6a0 != '\x1f') || (local_6a0._1_1_ != -0x75)) {
      local_4b8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4b8,
                 "BLENDER magic bytes are missing, couldn\'t find GZIP header either","");
      LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_4b8);
      if ((pointer)local_4b8._0_8_ != pcVar1) {
        operator_delete((void *)local_4b8._0_8_);
      }
    }
    LogFunctions<Assimp::BlenderImporter>::LogDebug((char *)0x492c84);
    if (local_6a0._2_1_ != '\b') {
      local_4b8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4b8,"Unsupported GZIP compression method","");
      LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_4b8);
      if ((pointer)local_4b8._0_8_ != pcVar1) {
        operator_delete((void *)local_4b8._0_8_);
      }
    }
    (*(local_698._M_ptr)->_vptr_IOStream[4])(local_698._M_ptr,0,0);
    local_648 = (StreamReader<false,_false> *)operator_new(0x38);
    local_658.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_698._M_ptr;
    local_658.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_698._M_refcount._M_pi;
    if ((BlenderImporter *)local_698._M_refcount._M_pi != (BlenderImporter *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
                    *)&(local_698._M_refcount._M_pi)->_M_use_count)->_M_t)._M_impl =
             *(int *)&(((map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
                         *)&(local_698._M_refcount._M_pi)->_M_use_count)->_M_t)._M_impl + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
                    *)&(local_698._M_refcount._M_pi)->_M_use_count)->_M_t)._M_impl =
             *(int *)&(((map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
                         *)&(local_698._M_refcount._M_pi)->_M_use_count)->_M_t)._M_impl + 1;
      }
    }
    StreamReader<false,_false>::StreamReader(local_648,&local_658,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Assimp::StreamReader<false,false>*>(&local_640,local_648);
    if ((BlenderImporter *)
        local_658.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (BlenderImporter *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_658.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    uStack_5c0 = 0;
    uStack_5bc = 0;
    uStack_5d0 = 0;
    uStack_5c8 = 0;
    local_5c4 = 0;
    local_620 = this;
    local_618 = pScene;
    inflateInit2_(&local_610,0x1f,"1.2.11",0x70);
    local_610 = local_648->current;
    local_608 = *(int *)&local_648->end - (int)local_610;
    sVar6 = 0;
    do {
      local_5f8 = local_4b8;
      local_5f0 = 0x400;
      uVar3 = inflate(&local_610,0);
      if (1 < uVar3) {
        local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_688,
                   "Failure decompressing this file using gzip, seemingly it is NOT a compressed .BLEND file"
                   ,"");
        LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_688);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_688._M_dataplus._M_p != &local_688.field_2) {
          operator_delete(local_688._M_dataplus._M_p);
        }
      }
      uVar5 = 0x400 - local_5f0;
      __new_size = uVar5 + sVar6;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_638,__new_size);
      memcpy(local_638.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + sVar6,local_4b8,(ulong)uVar5);
      sVar6 = __new_size;
    } while (uVar3 != 1);
    inflateEnd(&local_610);
    __p = (MemoryIOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
    (__p->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_00875cd0;
    __p->buffer = local_638.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    __p->length = __new_size;
    __p->pos = 0;
    __p->own = false;
    std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::MemoryIOStream>
              (&local_698,__p);
    (*(local_698._M_ptr)->_vptr_IOStream[2])(local_698._M_ptr,&local_6a0,7,1);
    pScene = local_618;
    this = local_620;
    if (local_6a0 != 0x5245444e454c42) {
      local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_688,"Found no BLENDER magic word in decompressed GZIP file","");
      LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_688);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_688._M_dataplus._M_p != &local_688.field_2) {
        operator_delete(local_688._M_dataplus._M_p);
      }
    }
    if (local_640._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_640._M_pi);
    }
  }
  (*(local_698._M_ptr)->_vptr_IOStream[2])(local_698._M_ptr,&local_6a0,1,1);
  local_5a0.i64bit = (char)local_6a0 == '-';
  (*(local_698._M_ptr)->_vptr_IOStream[2])(local_698._M_ptr,&local_6a0,1,1);
  local_5a0.little = (char)local_6a0 == 'v';
  (*(local_698._M_ptr)->_vptr_IOStream[2])(local_698._M_ptr,&local_6a0,3,1);
  local_6a0._0_4_ = (uint)(uint3)local_6a0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b8,"Blender version is ",0x13);
  local_610 = (int8_t *)CONCAT71(local_610._1_7_,(char)local_6a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,(char *)&local_610,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,".",1);
  local_610 = (int8_t *)((long)&local_6a0 + 1);
  poVar4 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_4b8
                      ,&local_610);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (64bit: ",9);
  pcVar7 = "false";
  local_688._M_dataplus._M_p = "false";
  if (local_5a0.i64bit != false) {
    local_688._M_dataplus._M_p = "true";
  }
  poVar4 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)poVar4,
                      (char **)&local_688);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", little endian: ",0x11);
  if (local_5a0.little != false) {
    pcVar7 = "true";
  }
  local_648 = (StreamReader<false,_false> *)pcVar7;
  poVar4 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)poVar4,
                      (char **)&local_648);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  LogFunctions<Assimp::BlenderImporter>::LogInfo((format *)poVar4);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
  this_00 = (BlenderImporter *)(local_4b8 + 0x70);
  std::ios_base::~ios_base((ios_base *)this_00);
  local_668.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_698._M_ptr;
  local_668.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_698._M_refcount._M_pi;
  if ((BlenderImporter *)local_698._M_refcount._M_pi != (BlenderImporter *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
                  *)&(local_698._M_refcount._M_pi)->_M_use_count)->_M_t)._M_impl =
           *(int *)&(((map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
                       *)&(local_698._M_refcount._M_pi)->_M_use_count)->_M_t)._M_impl + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
                  *)&(local_698._M_refcount._M_pi)->_M_use_count)->_M_t)._M_impl =
           *(int *)&(((map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
                       *)&(local_698._M_refcount._M_pi)->_M_use_count)->_M_t)._M_impl + 1;
    }
  }
  ParseBlendFile(this_00,&local_5a0,&local_668);
  this_01._M_pi =
       local_668.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((BlenderImporter *)
      local_668.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (BlenderImporter *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_668.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_4b8._8_8_ = (char *)0x0;
  local_4b8._0_8_ = &PTR__Scene_00878f08;
  local_4b8._24_8_ = 0;
  local_4b8._16_8_ = &PTR__ElemBase_00878f40;
  local_58 = (char *)0x0;
  local_90 = (element_type *)0x0;
  _Stack_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_80 = (element_type *)0x0;
  _Stack_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70 = (element_type *)0x0;
  _Stack_68._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60 = &PTR__ListBase_00878f78;
  local_50 = (element_type *)0x0;
  _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40 = (element_type *)0x0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ExtractScene((BlenderImporter *)this_01._M_pi,(Scene *)local_4b8,&local_5a0);
  ConvertBlendFile(this,pScene,(Scene *)local_4b8,&local_5a0);
  local_4b8._0_8_ = &PTR__Scene_00878f08;
  local_60 = &PTR__ListBase_00878f78;
  if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_38._M_pi);
  }
  if (_Stack_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_48._M_pi);
  }
  if (_Stack_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_68._M_pi);
  }
  if (_Stack_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_78._M_pi);
  }
  if (_Stack_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_88._M_pi);
  }
  if ((BlenderImporter *)local_698._M_refcount._M_pi != (BlenderImporter *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_698._M_refcount._M_pi);
  }
  std::
  vector<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>,_std::allocator<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>_>_>
  ::~vector((vector<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>,_std::allocator<std::map<Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>,_std::less<Assimp::Blender::Pointer>,_std::allocator<std::pair<const_Assimp::Blender::Pointer,_std::shared_ptr<Assimp::Blender::ElemBase>_>_>_>_>_>
             *)&local_5a0._cache);
  std::vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>::
  ~vector(&local_5a0.entries.
           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
         );
  if (local_5a0.reader.
      super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5a0.reader.
               super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_5a0.dna.indices._M_t);
  std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::~vector
            (&local_5a0.dna.structures.
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::shared_ptr<Assimp::Blender::ElemBase>_(Assimp::Blender::Structure::*)()_const,_void_(Assimp::Blender::Structure::*)(std::shared_ptr<Assimp::Blender::ElemBase>,_const_Assimp::Blender::FileDatabase_&)_const>_>_>_>
               *)&local_5a0.dna);
  if (local_638.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_638.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BlenderImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
#ifndef ASSIMP_BUILD_NO_COMPRESSED_BLEND
    std::vector<Bytef> uncompressed;
#endif


    FileDatabase file;
    std::shared_ptr<IOStream> stream(pIOHandler->Open(pFile,"rb"));
    if (!stream) {
        ThrowException("Could not open file for reading");
    }

    char magic[8] = {0};
    stream->Read(magic,7,1);
    if (strcmp(magic, Tokens[0] )) {
        // Check for presence of the gzip header. If yes, assume it is a
        // compressed blend file and try uncompressing it, else fail. This is to
        // avoid uncompressing random files which our loader might end up with.
#ifdef ASSIMP_BUILD_NO_COMPRESSED_BLEND
        ThrowException("BLENDER magic bytes are missing, is this file compressed (Assimp was built without decompression support)?");
#else

        if (magic[0] != 0x1f || static_cast<uint8_t>(magic[1]) != 0x8b) {
            ThrowException("BLENDER magic bytes are missing, couldn't find GZIP header either");
        }

        LogDebug("Found no BLENDER magic word but a GZIP header, might be a compressed file");
        if (magic[2] != 8) {
            ThrowException("Unsupported GZIP compression method");
        }

        // http://www.gzip.org/zlib/rfc-gzip.html#header-trailer
        stream->Seek(0L,aiOrigin_SET);
        std::shared_ptr<StreamReaderLE> reader = std::shared_ptr<StreamReaderLE>(new StreamReaderLE(stream));

        // build a zlib stream
        z_stream zstream;
        zstream.opaque = Z_NULL;
        zstream.zalloc = Z_NULL;
        zstream.zfree  = Z_NULL;
        zstream.data_type = Z_BINARY;

        // http://hewgill.com/journal/entries/349-how-to-decompress-gzip-stream-with-zlib
        inflateInit2(&zstream, 16+MAX_WBITS);

        zstream.next_in   = reinterpret_cast<Bytef*>( reader->GetPtr() );
        zstream.avail_in  = reader->GetRemainingSize();

        size_t total = 0l;

        // TODO: be smarter about this, decompress directly into heap buffer
        // and decompress the data .... do 1k chunks in the hope that we won't kill the stack
#define MYBLOCK 1024
        Bytef block[MYBLOCK];
        int ret;
        do {
            zstream.avail_out = MYBLOCK;
            zstream.next_out = block;
            ret = inflate(&zstream, Z_NO_FLUSH);

            if (ret != Z_STREAM_END && ret != Z_OK) {
                ThrowException("Failure decompressing this file using gzip, seemingly it is NOT a compressed .BLEND file");
            }
            const size_t have = MYBLOCK - zstream.avail_out;
            total += have;
            uncompressed.resize(total);
            memcpy(uncompressed.data() + total - have,block,have);
        }
        while (ret != Z_STREAM_END);

        // terminate zlib
        inflateEnd(&zstream);

        // replace the input stream with a memory stream
        stream.reset(new MemoryIOStream(reinterpret_cast<uint8_t*>(uncompressed.data()),total));

        // .. and retry
        stream->Read(magic,7,1);
        if (strcmp(magic,"BLENDER")) {
            ThrowException("Found no BLENDER magic word in decompressed GZIP file");
        }
#endif
    }

    file.i64bit = (stream->Read(magic,1,1),magic[0]=='-');
    file.little = (stream->Read(magic,1,1),magic[0]=='v');

    stream->Read(magic,3,1);
    magic[3] = '\0';

    LogInfo((format(),"Blender version is ",magic[0],".",magic+1,
        " (64bit: ",file.i64bit?"true":"false",
        ", little endian: ",file.little?"true":"false",")"
    ));

    ParseBlendFile(file,stream);

    Scene scene;
    ExtractScene(scene,file);

    ConvertBlendFile(pScene,scene,file);
}